

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  u8 *puVar1;
  char **ppcVar2;
  VtabCtx *pVVar3;
  sqlite3_vtab *psVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  VTable *pVTab;
  char *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int local_80;
  char *zErr;
  char *local_48;
  VtabCtx sCtx;
  
  ppcVar2 = pTab->azModuleArg;
  iVar7 = pTab->nModuleArg;
  zErr = (char *)0x0;
  local_48 = sqlite3MPrintf(db,"%s",pTab->zName);
  if (local_48 == (char *)0x0) {
    return 7;
  }
  pVTab = (VTable *)sqlite3DbMallocZero(db,0x30);
  if (pVTab == (VTable *)0x0) {
    sqlite3DbFree(db,local_48);
    return 7;
  }
  pVTab->db = db;
  pVTab->pMod = pMod;
  iVar5 = sqlite3SchemaToIndex(db,pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iVar5].zName;
  pVVar3 = db->pVtabCtx;
  db->pVtabCtx = &sCtx;
  sCtx.pVTable = pVTab;
  sCtx.pTab = pTab;
  local_80 = (*xConstruct)(db,pMod->pAux,iVar7,ppcVar2,&pVTab->pVtab,&zErr);
  db->pVtabCtx = pVVar3;
  if (local_80 == 0) {
    psVar4 = pVTab->pVtab;
    if (psVar4 != (sqlite3_vtab *)0x0) {
      psVar4->zErrMsg = (char *)0x0;
      psVar4->pModule = (sqlite3_module *)0x0;
      *(undefined8 *)&psVar4->nRef = 0;
      pVTab->pVtab->pModule = pMod->pModule;
      pVTab->nRef = 1;
      if (sCtx.pTab != (Table *)0x0) {
        pcVar8 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pTab->zName);
        *pzErr = pcVar8;
        sqlite3VtabUnlock(pVTab);
        local_80 = 1;
        goto LAB_00136d48;
      }
      pVTab->pNext = pTab->pVTable;
      pTab->pVTable = pVTab;
      for (lVar11 = 0; lVar11 < pTab->nCol; lVar11 = lVar11 + 1) {
        pcVar8 = pTab->aCol[lVar11].zType;
        if (pcVar8 != (char *)0x0) {
          uVar6 = sqlite3Strlen30(pcVar8);
          iVar7 = sqlite3_strnicmp("hidden",pcVar8,6);
          if ((iVar7 == 0) && (uVar13 = 0, (pcVar8[6] & 0xdfU) == 0)) {
LAB_00136e1c:
            iVar7 = (int)uVar13;
            if (iVar7 < (int)uVar6) {
              lVar9 = (long)iVar7;
              lVar10 = 7 - (ulong)(pcVar8[lVar9 + 6] == '\0');
              for (lVar12 = lVar9; (ulong)(lVar10 + lVar12) <= (ulong)uVar6; lVar12 = lVar12 + 1) {
                pcVar8[lVar12] = pcVar8[lVar12 + lVar10];
              }
              if ((0 < iVar7) && (pcVar8[lVar9] == '\0')) {
                pcVar8[uVar13 - 1] = '\0';
              }
              puVar1 = &pTab->aCol[lVar11].colFlags;
              *puVar1 = *puVar1 | 2;
            }
          }
          else {
            for (uVar13 = 0; uVar6 != uVar13; uVar13 = uVar13 + 1) {
              iVar7 = sqlite3_strnicmp(" hidden",pcVar8 + uVar13,7);
              if ((iVar7 == 0) && ((pcVar8[uVar13 + 7] & 0xdfU) == 0)) {
                uVar13 = (ulong)((int)uVar13 + 1);
                goto LAB_00136e1c;
              }
            }
          }
        }
      }
    }
    local_80 = 0;
  }
  else {
    if (local_80 == 7) {
      db->mallocFailed = '\x01';
    }
    if (zErr == (char *)0x0) {
      pcVar8 = sqlite3MPrintf(db,"vtable constructor failed: %s",local_48);
      *pzErr = pcVar8;
    }
    else {
      pcVar8 = sqlite3MPrintf(db,"%s");
      *pzErr = pcVar8;
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db,pVTab);
  }
LAB_00136d48:
  sqlite3DbFree(db,local_48);
  return local_80;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db, 
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx, *pPriorCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg = (const char *const*)pTab->azModuleArg;
  int nArg = pTab->nModuleArg;
  char *zErr = 0;
  char *zModuleName = sqlite3MPrintf(db, "%s", pTab->zName);
  int iDb;

  if( !zModuleName ){
    return SQLITE_NOMEM;
  }

  pVTable = sqlite3DbMallocZero(db, sizeof(VTable));
  if( !pVTable ){
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iDb].zName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  pPriorCtx = db->pVtabCtx;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = pPriorCtx;
  if( rc==SQLITE_NOMEM ) db->mallocFailed = 1;

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pVTable->nRef = 1;
    if( sCtx.pTab ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->pVTable. Then loop through the 
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->pVTable;
      pTab->pVTable = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = pTab->aCol[iCol].zType;
        int nType;
        int i = 0;
        if( !zType ) continue;
        nType = sqlite3Strlen30(zType);
        if( sqlite3StrNICmp("hidden", zType, 6)||(zType[6] && zType[6]!=' ') ){
          for(i=0; i<nType; i++){
            if( (0==sqlite3StrNICmp(" hidden", &zType[i], 7))
             && (zType[i+7]=='\0' || zType[i+7]==' ')
            ){
              i++;
              break;
            }
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}